

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_search_demo.cpp
# Opt level: O0

vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_> *
__thiscall GetSquareCellNeighbour::operator()(GetSquareCellNeighbour *this,SquareCell cell)

{
  bool bVar1;
  int *in_RSI;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  long in_stack_00000008;
  long in_stack_00000010;
  SquareCell ncell;
  uint64_t new_id;
  int i;
  Index pos [4];
  vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
  *adjacent_cells;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *__lhs;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  SquareCell local_b0;
  unsigned_long *local_98;
  unsigned_long *local_80;
  unsigned_long *local_78;
  unsigned_long *local_70;
  long local_68;
  int local_5c;
  long local_58 [4];
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __first._M_current = in_RDI._M_current;
  std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>::
  vector((vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_> *
         )0x1048db);
  local_58[1] = in_stack_00000010 + 1;
  local_58[3] = in_stack_00000010 + -1;
  local_38 = in_stack_00000008 + 1;
  local_30 = in_stack_00000010;
  local_28 = in_stack_00000008 + -1;
  local_20 = in_stack_00000010;
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    if ((((-1 < local_58[(long)local_5c * 2]) && (local_58[(long)local_5c * 2] < (long)in_RSI[1]))
        && (-1 < local_58[(long)local_5c * 2 + 1])) &&
       (local_58[(long)local_5c * 2 + 1] < (long)*in_RSI)) {
      local_68 = local_58[(long)local_5c * 2 + 1] * (long)in_RSI[1] + local_58[(long)local_5c * 2];
      __lhs = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               *)(in_RSI + 4);
      local_78 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_ffffffffffffff18);
      local_80 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff28 =
           std::
           find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                     (__first,in_RDI,in_stack_ffffffffffffff28._M_current);
      local_70 = in_stack_ffffffffffffff28._M_current;
      local_98 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (in_stack_ffffffffffffff18);
      bVar1 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_ffffffffffffff18);
      if (!bVar1) {
        SquareCell::SquareCell(&local_b0,local_68);
        local_b0.idx.x = local_58[(long)local_5c * 2];
        local_b0.idx.y = local_58[(long)local_5c * 2 + 1];
        std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>::
        emplace_back<SquareCell&,double&>
                  ((vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
                    *)in_RDI._M_current,(SquareCell *)in_stack_ffffffffffffff28._M_current,
                   (double *)__lhs);
      }
    }
  }
  return (vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_> *
         )__first._M_current;
}

Assistant:

std::vector<std::tuple<SquareCell, double>> operator()(SquareCell cell) {
    std::vector<std::tuple<SquareCell, double>> adjacent_cells;

    Index pos[4];

    pos[0].x = cell.idx.x;
    pos[0].y = cell.idx.y + 1;

    pos[1].x = cell.idx.x;
    pos[1].y = cell.idx.y - 1;

    pos[2].x = cell.idx.x + 1;
    pos[2].y = cell.idx.y;

    pos[3].x = cell.idx.x - 1;
    pos[3].y = cell.idx.y;

    for (int i = 0; i < 4; i++) {
      if (pos[i].x >= 0 && pos[i].x < col_size_ && pos[i].y >= 0 &&
          pos[i].y < row_size_) {
        uint64_t new_id = pos[i].y * col_size_ + pos[i].x;

        if (std::find(obstacle_ids_.begin(), obstacle_ids_.end(), new_id) !=
            obstacle_ids_.end())
          continue;

        SquareCell ncell(new_id);
        ncell.idx.x = pos[i].x;
        ncell.idx.y = pos[i].y;

        adjacent_cells.emplace_back(ncell, cell_size_);
      }
    }

    return adjacent_cells;
  }